

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark_branchfree.cpp
# Opt level: O0

result_t benchmark_sum_dividers<long,std::vector<libdivide::divider<long,(libdivide::Branching)0>,std::allocator<libdivide::divider<long,(libdivide::Branching)0>>>>
                   (vector<libdivide::divider<long,_(libdivide::Branching)0>,_std::allocator<libdivide::divider<long,_(libdivide::Branching)0>_>_>
                    *dividers,size_t iters)

{
  result_t rVar1;
  long *plVar2;
  size_t sVar3;
  duration<double,_std::ratio<1L,_1L>_> *this;
  long in_RSI;
  rep_conflict rVar4;
  duration<double,_std::ratio<1L,_1L>_> seconds;
  time_point t2;
  long numerator;
  size_t sum;
  time_point t1;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_ffffffffffffffa0;
  duration<double,_std::ratio<1L,_1L>_> in_stack_ffffffffffffffa8;
  long local_48 [2];
  size_t numerator_00;
  long local_20;
  
  std::chrono::_V2::system_clock::now();
  numerator_00 = 0;
  for (local_20 = in_RSI; local_20 != 0; local_20 = local_20 + -1) {
    local_48[1] = 2;
    local_48[0] = local_20;
    plVar2 = std::max<long>(local_48 + 1,local_48);
    sVar3 = sum_dividers<long,std::vector<libdivide::divider<long,(libdivide::Branching)0>,std::allocator<libdivide::divider<long,(libdivide::Branching)0>>>>
                      (numerator_00,
                       (vector<libdivide::divider<long,_(libdivide::Branching)0>,_std::allocator<libdivide::divider<long,_(libdivide::Branching)0>_>_>
                        *)*plVar2);
    numerator_00 = sVar3 + numerator_00;
  }
  this = (duration<double,_std::ratio<1L,_1L>_> *)std::chrono::_V2::system_clock::now();
  std::chrono::operator-
            ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              *)in_stack_ffffffffffffffa8.__r,in_stack_ffffffffffffffa0);
  std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
            (this,(duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_ffffffffffffffa8.__r);
  rVar4 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count
                    ((duration<double,_std::ratio<1L,_1L>_> *)&stack0xffffffffffffffa8);
  rVar1.sum = numerator_00;
  rVar1.duration = rVar4;
  return rVar1;
}

Assistant:

NOINLINE result_t benchmark_sum_dividers(const D& dividers, size_t iters) {
    auto t1 = std::chrono::system_clock::now();
    size_t sum = 0;

    for (; iters > 0; iters--) {
        // Unsigned branchfree divider cannot be 1
        T numerator = std::max((T)2, (T)iters);
        sum += sum_dividers(numerator, dividers);
    }

    auto t2 = std::chrono::system_clock::now();
    std::chrono::duration<double> seconds = t2 - t1;
    return result_t{seconds.count(), sum};
}